

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall Memory::Recycler::FindRoots(Recycler *this)

{
  size_t *psVar1;
  size_t sVar2;
  code *pcVar3;
  bool bVar4;
  size_t sVar5;
  GuestArenaAllocator *pGVar6;
  size_t sVar7;
  ArenaData **ppAVar8;
  undefined4 *puVar9;
  undefined8 *in_FS_OFFSET;
  undefined1 local_50 [8];
  EditingIterator guestArenaIter;
  Iterator externalGuestArenaIter;
  
  sVar2 = (this->collectionStats).markData.markCount;
  if ((this->externalRootMarker != (ExternalRootMarker)0x0) && (this->inPartialCollectMode == false)
     ) {
    bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,MarkPhase);
    if ((bVar4) ||
       (bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,FindRootPhase), bVar4)) {
      this->forceTraceMark = true;
      Output::Print(L"Scanning External Roots: ");
    }
    if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
      RecyclerObjectGraphDumper::BeginDumpObject(this->objectGraphDumper,L"External Roots");
    }
    (*this->externalRootMarker)(this->externalRootMarkerContext);
    if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
      RecyclerObjectGraphDumper::EndDumpObject(this->objectGraphDumper);
    }
    bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,MarkPhase);
    if ((bVar4) ||
       (bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,FindRootPhase), bVar4)) {
      this->forceTraceMark = false;
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,MarkPhase);
  if ((bVar4) ||
     (bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,FindRootPhase), bVar4)) {
    this->forceTraceMark = true;
    Output::Print(L"Scanning Pinned Objects: ");
  }
  sVar5 = ScanPinnedObjects<false>(this);
  bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,MarkPhase);
  if ((bVar4) ||
     (bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,FindRootPhase), bVar4)) {
    this->forceTraceMark = false;
    Output::Print(L"\n");
    Output::Flush();
  }
  if (this->hasPendingConcurrentFindRoot == false) {
    puVar9 = (undefined4 *)*in_FS_OFFSET;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)*in_FS_OFFSET;
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x76f,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar4) {
LAB_00269766:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  local_50 = (undefined1  [8])&this->guestArenaList;
  guestArenaIter.super_Iterator.list =
       (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_50;
  while( true ) {
    if (guestArenaIter.super_Iterator.list ==
        (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00269766;
      *puVar9 = 0;
    }
    guestArenaIter.super_Iterator.list =
         ((guestArenaIter.super_Iterator.list)->
         super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
    if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_50) break;
    pGVar6 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_50);
    if (pGVar6->pendingDelete == true) {
      if (this->hasPendingDeleteGuestArena == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x779,"(this->hasPendingDeleteGuestArena)",
                           "this->hasPendingDeleteGuestArena");
        if (!bVar4) goto LAB_00269766;
        *puVar9 = 0;
      }
      (pGVar6->super_ArenaAllocator).
      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
      lockBlockList = false;
      DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
      RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)local_50,&HeapAllocator::Instance);
    }
    else if (this->backgroundFinishMarkCount == '\0') {
      sVar7 = ScanArena(this,&(pGVar6->super_ArenaAllocator).
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              .super_ArenaData,false);
      sVar5 = sVar5 + sVar7;
    }
  }
  guestArenaIter.super_Iterator.list =
       (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
  this->hasPendingDeleteGuestArena = false;
  guestArenaIter.super_Iterator.current = (NodeBase *)&this->externalGuestArenaList;
  externalGuestArenaIter.list =
       (DListBase<Memory::ArenaData_*,_RealCount> *)guestArenaIter.super_Iterator.current;
  do {
    if (externalGuestArenaIter.list == (DListBase<Memory::ArenaData_*,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00269766;
      *puVar9 = 0;
    }
    externalGuestArenaIter.list =
         ((externalGuestArenaIter.list)->super_DListNodeBase<Memory::ArenaData_*>).next.list;
    if (externalGuestArenaIter.list ==
        (DListBase<Memory::ArenaData_*,_RealCount> *)guestArenaIter.super_Iterator.current) {
      ScanImplicitRoots(this);
      psVar1 = &(this->collectionStats).rootCount;
      *psVar1 = *psVar1 + ((this->collectionStats).markData.markCount - sVar2);
      return sVar5;
    }
    ppAVar8 = DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Data
                        ((Iterator *)&guestArenaIter.super_Iterator.current);
    sVar7 = ScanArena(this,*ppAVar8,false);
    sVar5 = sVar5 + sVar7;
  } while( true );
}

Assistant:

size_t
Recycler::FindRoots()
{
    size_t scanRootBytes = 0;
#ifdef RECYCLER_STATS
    size_t lastMarkCount = this->collectionStats.markData.markCount;
#endif

    GCETW(GC_SCANROOTS_START, (this));

    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindRootPhase);

    // go through ITracker* stuff. Don't need to do it if we are doing a partial collection
    // as we keep track and mark all trackable objects.
    // Do this first because the host might unpin stuff in the process
    if (externalRootMarker != NULL)
    {
#if ENABLE_PARTIAL_GC
        if (!this->inPartialCollectMode)
#endif
        {
            RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindRootExtPhase);
#if DBG_DUMP
            if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
                || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
            {
                this->forceTraceMark = true;
                Output::Print(_u("Scanning External Roots: "));
            }
#endif
            BEGIN_DUMP_OBJECT(this, _u("External Roots"));

            // PARTIALGC-TODO: How do we count external roots?
            externalRootMarker(externalRootMarkerContext);
            END_DUMP_OBJECT(this);
#if DBG_DUMP
            if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
                || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
            {
                this->forceTraceMark = false;
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
            RECYCLER_PROFILE_EXEC_END(this, Js::FindRootExtPhase);
        }
    }

#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = true;
        Output::Print(_u("Scanning Pinned Objects: "));
    }
#endif

    scanRootBytes += this->ScanPinnedObjects</*background = */false>();

#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = false;
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

#if ENABLE_CONCURRENT_GC
    Assert(!this->hasPendingConcurrentFindRoot);
#endif
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindRootArenaPhase);
    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
#if ENABLE_CONCURRENT_GC
        if (allocator.pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
            allocator.SetLockBlockList(false);

            guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
        }
        else if (this->backgroundFinishMarkCount == 0)
#endif
        {
            // Only scan arena if we haven't finished mark in the background
            // (which is true if concurrent GC is disabled)
            scanRootBytes += ScanArena(&allocator, false);
        }
    }
    this->hasPendingDeleteGuestArena = false;

    DList<ArenaData *, HeapAllocator>::Iterator externalGuestArenaIter(&externalGuestArenaList);
    while (externalGuestArenaIter.Next())
    {
        scanRootBytes += ScanArena(externalGuestArenaIter.Data(), false);
    }
    RECYCLER_PROFILE_EXEC_END(this, Js::FindRootArenaPhase);

    this->ScanImplicitRoots();

    RECYCLER_PROFILE_EXEC_END(this, Js::FindRootPhase);
    GCETW(GC_SCANROOTS_STOP, (this));
    RECYCLER_STATS_ADD(this, rootCount, this->collectionStats.markData.markCount - lastMarkCount);
    return scanRootBytes;
}